

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_long_type_param_tests.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  UnitTestSource *pUVar4;
  int iVar5;
  unsigned_long *in_R9;
  AssertionResult iutest_ar;
  iuCodeMessage local_4e8;
  int argc_local;
  string xml_type_param2;
  string xml_type_param1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  string local_3b0;
  string local_390;
  string type_param2;
  string type_param1;
  ReturnTypedFixed<int> local_330;
  iuStreamMessage local_1a0;
  
  argc_local = argc;
  iutest::detail::InitIrisUnitTest<char**>(&argc_local,argv);
  iutest::detail::
  GetTypeNameProxy<iutest::Types<int,float,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None>>
  ::GetTypeName_abi_cxx11_();
  iutest::detail::
  GetTypeName<TestType<TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone>>
            ();
  std::__cxx11::string::string((string *)&local_390,(string *)&type_param1);
  iutest::DefaultXmlGeneratorListener::EscapeXmlAttribute(&xml_type_param1,&local_390);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::string((string *)&local_3b0,(string *)&type_param2);
  iutest::DefaultXmlGeneratorListener::EscapeXmlAttribute(&xml_type_param2,&local_3b0);
  std::__cxx11::string::~string((string *)&local_3b0);
  iutest::TestEnv::
  OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>::
  OptionString((OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>
                *)&local_330);
  iutest::TestEnv::
  OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>::
  operator=((OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>
             *)&local_330,"xml:test.xml");
  std::__cxx11::string::~string((string *)&local_330);
  pUVar4 = iutest::UnitTestSource::GetInstance();
  iVar2 = iutest::UnitTestSource::Run(pUVar4);
  iVar5 = 1;
  if (iVar2 == 0) {
    iVar2 = 0;
    local_330.fixed.super_Message.m_stream.super_iu_stringstream._0_8_ =
         std::__cxx11::string::find((char *)&FileIO::s_io_abi_cxx11_,0x128189);
    iutest::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              (&iutest_ar,(internal *)"::std::string::npos",
               "FileIO::s_io.find(\"iutest::detail::None\")",(char *)&std::__cxx11::string::npos,
               (unsigned_long *)&local_330,in_R9);
    bVar1 = iutest_ar.m_result;
    if (iutest_ar.m_result == false) {
      memset(&local_1a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_1a0.m_stream);
      std::__cxx11::string::string((string *)&local_3d0,(string *)&FileIO::s_io_abi_cxx11_);
      iutest::detail::iuStreamMessage::operator<<(&local_1a0,&local_3d0);
      iutest::detail::iuStreamMessage::iuStreamMessage((iuStreamMessage *)&local_330,&local_1a0);
      local_330.ret.value = 1;
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_4e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_long_type_param_tests.cpp"
                 ,0x5d,iutest_ar.m_message._M_dataplus._M_p);
      local_4e8._44_4_ = 2;
      iVar2 = iutest::AssertionHelper::operator=((AssertionHelper *)&local_4e8,&local_330);
      std::__cxx11::string::~string((string *)&local_4e8);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_330);
      std::__cxx11::string::~string((string *)&local_3d0);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_1a0.m_stream);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    iVar5 = iVar2;
    if (bVar1 != false) {
      local_330.fixed.super_Message.m_stream.super_iu_stringstream._0_8_ =
           std::__cxx11::string::find((string *)&FileIO::s_io_abi_cxx11_,(ulong)&xml_type_param1);
      iutest::internal::CmpHelperNE<unsigned_long,unsigned_long>
                (&iutest_ar,(internal *)"::std::string::npos","FileIO::s_io.find(xml_type_param1)",
                 (char *)&std::__cxx11::string::npos,(unsigned_long *)&local_330,in_R9);
      bVar1 = iutest_ar.m_result;
      if (iutest_ar.m_result == false) {
        memset(&local_1a0,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_1a0.m_stream);
        std::__cxx11::string::string((string *)&local_3f0,(string *)&FileIO::s_io_abi_cxx11_);
        iutest::detail::iuStreamMessage::operator<<(&local_1a0,&local_3f0);
        iutest::detail::iuStreamMessage::iuStreamMessage((iuStreamMessage *)&local_330,&local_1a0);
        local_330.ret.value = 1;
        iutest::detail::iuCodeMessage::iuCodeMessage
                  (&local_4e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_long_type_param_tests.cpp"
                   ,0x5e,iutest_ar.m_message._M_dataplus._M_p);
        local_4e8._44_4_ = 2;
        iVar2 = iutest::AssertionHelper::operator=((AssertionHelper *)&local_4e8,&local_330);
        std::__cxx11::string::~string((string *)&local_4e8);
        iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                  ((iu_global_format_stringstream *)&local_330);
        std::__cxx11::string::~string((string *)&local_3f0);
        iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_1a0.m_stream);
      }
      std::__cxx11::string::~string((string *)&iutest_ar);
      iVar5 = iVar2;
      if (bVar1 != false) {
        local_330.fixed.super_Message.m_stream.super_iu_stringstream._0_8_ =
             std::__cxx11::string::find((string *)&FileIO::s_io_abi_cxx11_,(ulong)&xml_type_param2);
        iutest::internal::CmpHelperNE<unsigned_long,unsigned_long>
                  (&iutest_ar,(internal *)"::std::string::npos","FileIO::s_io.find(xml_type_param2)"
                   ,(char *)&std::__cxx11::string::npos,(unsigned_long *)&local_330,in_R9);
        bVar1 = iutest_ar.m_result;
        if (iutest_ar.m_result == false) {
          memset(&local_1a0,0,0x188);
          iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_1a0.m_stream);
          std::__cxx11::string::string((string *)&local_410,(string *)&FileIO::s_io_abi_cxx11_);
          iutest::detail::iuStreamMessage::operator<<(&local_1a0,&local_410);
          iutest::detail::iuStreamMessage::iuStreamMessage((iuStreamMessage *)&local_330,&local_1a0)
          ;
          local_330.ret.value = 1;
          iutest::detail::iuCodeMessage::iuCodeMessage
                    (&local_4e8,
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_long_type_param_tests.cpp"
                     ,0x5f,iutest_ar.m_message._M_dataplus._M_p);
          local_4e8._44_4_ = 2;
          iVar2 = iutest::AssertionHelper::operator=((AssertionHelper *)&local_4e8,&local_330);
          std::__cxx11::string::~string((string *)&local_4e8);
          iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                    ((iu_global_format_stringstream *)&local_330);
          std::__cxx11::string::~string((string *)&local_410);
          iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_1a0.m_stream)
          ;
        }
        std::__cxx11::string::~string((string *)&iutest_ar);
        iVar5 = iVar2;
        if (bVar1 != false) {
          FileIO::s_io_abi_cxx11_._M_string_length = 0;
          *FileIO::s_io_abi_cxx11_._M_dataplus._M_p = '\0';
          iutest::TestEnv::
          OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>
          ::OptionString((OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>
                          *)&local_330);
          iutest::TestEnv::
          OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>
          ::operator=((OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>
                       *)&local_330,"junit:test.xml");
          std::__cxx11::string::~string((string *)&local_330);
          pUVar4 = iutest::UnitTestSource::GetInstance();
          iVar3 = iutest::UnitTestSource::Run(pUVar4);
          iVar5 = 1;
          if (iVar3 == 0) {
            local_330.fixed.super_Message.m_stream.super_iu_stringstream._0_8_ =
                 std::__cxx11::string::find((char *)&FileIO::s_io_abi_cxx11_,0x128189);
            iutest::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                      (&iutest_ar,(internal *)"::std::string::npos",
                       "FileIO::s_io.find(\"iutest::detail::None\")",
                       (char *)&std::__cxx11::string::npos,(unsigned_long *)&local_330,in_R9);
            bVar1 = iutest_ar.m_result;
            if (iutest_ar.m_result == false) {
              memset(&local_1a0,0,0x188);
              iutest::iu_global_format_stringstream::iu_global_format_stringstream
                        (&local_1a0.m_stream);
              std::__cxx11::string::string((string *)&local_430,(string *)&FileIO::s_io_abi_cxx11_);
              iutest::detail::iuStreamMessage::operator<<(&local_1a0,&local_430);
              iutest::detail::iuStreamMessage::iuStreamMessage
                        ((iuStreamMessage *)&local_330,&local_1a0);
              local_330.ret.value = 1;
              iutest::detail::iuCodeMessage::iuCodeMessage
                        (&local_4e8,
                         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_long_type_param_tests.cpp"
                         ,0x68,iutest_ar.m_message._M_dataplus._M_p);
              local_4e8._44_4_ = 2;
              iVar2 = iutest::AssertionHelper::operator=((AssertionHelper *)&local_4e8,&local_330);
              std::__cxx11::string::~string((string *)&local_4e8);
              iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                        ((iu_global_format_stringstream *)&local_330);
              std::__cxx11::string::~string((string *)&local_430);
              iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                        (&local_1a0.m_stream);
            }
            std::__cxx11::string::~string((string *)&iutest_ar);
            iVar5 = iVar2;
            if (bVar1 != false) {
              local_330.fixed.super_Message.m_stream.super_iu_stringstream._0_8_ =
                   std::__cxx11::string::find
                             ((string *)&FileIO::s_io_abi_cxx11_,(ulong)&xml_type_param1);
              iutest::internal::CmpHelperNE<unsigned_long,unsigned_long>
                        (&iutest_ar,(internal *)"::std::string::npos",
                         "FileIO::s_io.find(xml_type_param1)",(char *)&std::__cxx11::string::npos,
                         (unsigned_long *)&local_330,in_R9);
              bVar1 = iutest_ar.m_result;
              if (iutest_ar.m_result == false) {
                memset(&local_1a0,0,0x188);
                iutest::iu_global_format_stringstream::iu_global_format_stringstream
                          (&local_1a0.m_stream);
                std::__cxx11::string::string
                          ((string *)&local_450,(string *)&FileIO::s_io_abi_cxx11_);
                iutest::detail::iuStreamMessage::operator<<(&local_1a0,&local_450);
                iutest::detail::iuStreamMessage::iuStreamMessage
                          ((iuStreamMessage *)&local_330,&local_1a0);
                local_330.ret.value = 1;
                iutest::detail::iuCodeMessage::iuCodeMessage
                          (&local_4e8,
                           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_long_type_param_tests.cpp"
                           ,0x69,iutest_ar.m_message._M_dataplus._M_p);
                local_4e8._44_4_ = 2;
                iVar2 = iutest::AssertionHelper::operator=((AssertionHelper *)&local_4e8,&local_330)
                ;
                std::__cxx11::string::~string((string *)&local_4e8);
                iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                          ((iu_global_format_stringstream *)&local_330);
                std::__cxx11::string::~string((string *)&local_450);
                iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                          (&local_1a0.m_stream);
              }
              std::__cxx11::string::~string((string *)&iutest_ar);
              iVar5 = iVar2;
              if (bVar1 != false) {
                local_330.fixed.super_Message.m_stream.super_iu_stringstream._0_8_ =
                     std::__cxx11::string::find
                               ((string *)&FileIO::s_io_abi_cxx11_,(ulong)&xml_type_param2);
                iutest::internal::CmpHelperNE<unsigned_long,unsigned_long>
                          (&iutest_ar,(internal *)"::std::string::npos",
                           "FileIO::s_io.find(xml_type_param2)",(char *)&std::__cxx11::string::npos,
                           (unsigned_long *)&local_330,in_R9);
                if (iutest_ar.m_result == false) {
                  memset(&local_1a0,0,0x188);
                  iutest::iu_global_format_stringstream::iu_global_format_stringstream
                            (&local_1a0.m_stream);
                  std::__cxx11::string::string
                            ((string *)&local_470,(string *)&FileIO::s_io_abi_cxx11_);
                  iutest::detail::iuStreamMessage::operator<<(&local_1a0,&local_470);
                  iutest::detail::iuStreamMessage::iuStreamMessage
                            ((iuStreamMessage *)&local_330,&local_1a0);
                  local_330.ret.value = 1;
                  iutest::detail::iuCodeMessage::iuCodeMessage
                            (&local_4e8,
                             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_long_type_param_tests.cpp"
                             ,0x6a,iutest_ar.m_message._M_dataplus._M_p);
                  local_4e8._44_4_ = 2;
                  iVar2 = iutest::AssertionHelper::operator=
                                    ((AssertionHelper *)&local_4e8,&local_330);
                  std::__cxx11::string::~string((string *)&local_4e8);
                  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                            ((iu_global_format_stringstream *)&local_330);
                  std::__cxx11::string::~string((string *)&local_470);
                  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                            (&local_1a0.m_stream);
                }
                std::__cxx11::string::~string((string *)&iutest_ar);
                iVar5 = iVar2;
                if (iutest_ar.m_result != false) {
                  FileIO::s_io_abi_cxx11_._M_string_length = 0;
                  *FileIO::s_io_abi_cxx11_._M_dataplus._M_p = '\0';
                  puts("*** Successful ***");
                  iVar5 = 0;
                }
              }
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&xml_type_param2);
  std::__cxx11::string::~string((string *)&xml_type_param1);
  std::__cxx11::string::~string((string *)&type_param2);
  std::__cxx11::string::~string((string *)&type_param1);
  return iVar5;
}

Assistant:

int main(int argc, char* argv[])
#endif
{
#if OUTPUT_XML_TEST
    IUTEST_INIT(&argc, argv);

    const ::std::string type_param1 = iutest::detail::GetTypeNameProxy< ::iutest::Types<int, float> >::GetTypeName();
    const ::std::string type_param2 = iutest::detail::GetTypeNameProxy< AliasTestType >::GetTypeName();
    const ::std::string xml_type_param1 = HackXmlGeneratorListener::EscapeXmlAttribute(type_param1);
    const ::std::string xml_type_param2 = HackXmlGeneratorListener::EscapeXmlAttribute(type_param2);

    ::iutest::IUTEST_FLAG(output) = "xml:test.xml";
    {
        const int ret = IUTEST_RUN_ALL_TESTS();

        if( ret != 0 ) return 1;
        IUTEST_ASSERT_EQ(::std::string::npos, FileIO::s_io.find("iutest::detail::None")) << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find(xml_type_param1)) << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find(xml_type_param2)) << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        FileIO::s_io.clear();
    }

    ::iutest::IUTEST_FLAG(output) = "junit:test.xml";
    {
        const int ret = IUTEST_RUN_ALL_TESTS();

        if( ret != 0 ) return 1;
        IUTEST_ASSERT_EQ(::std::string::npos, FileIO::s_io.find("iutest::detail::None")) << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find(xml_type_param1)) << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find(xml_type_param2)) << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        FileIO::s_io.clear();
    }
    printf("*** Successful ***\n");
#else
    (void)argc;
    (void)argv;
    printf("*** OUTPUT_XML_TEST=0 ***\n");
#endif
    return 0;
}